

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-threadpool-cancel.c
# Opt level: O2

int run_test_threadpool_cancel_single(void)

{
  int iVar1;
  uv_loop_t *loop;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_a;
  uv_work_t req;
  
  saturate_threadpool();
  loop = uv_default_loop();
  iVar1 = uv_queue_work(loop,&req,abort,nop_done_cb);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    iVar1 = uv_cancel((uv_req_t *)&req);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      eval_a = (int64_t)done_cb_called;
      eval_b = 0;
      if (eval_a == 0) {
        unblock_threadpool();
        iVar1 = uv_run(loop,UV_RUN_DEFAULT);
        eval_a = (int64_t)iVar1;
        eval_b = 0;
        if (eval_a == 0) {
          eval_a = 1;
          eval_b = (int64_t)done_cb_called;
          if (eval_b == 1) {
            close_loop(loop);
            eval_a = 0;
            iVar1 = uv_loop_close(loop);
            eval_b = (int64_t)iVar1;
            if (eval_b == 0) {
              uv_library_shutdown();
              return 0;
            }
            pcVar4 = "uv_loop_close(loop)";
            pcVar3 = "0";
            uVar2 = 0x17f;
          }
          else {
            pcVar4 = "done_cb_called";
            pcVar3 = "1";
            uVar2 = 0x17d;
          }
        }
        else {
          pcVar4 = "0";
          pcVar3 = "uv_run(loop, UV_RUN_DEFAULT)";
          uVar2 = 0x17c;
        }
      }
      else {
        pcVar4 = "0";
        pcVar3 = "done_cb_called";
        uVar2 = 0x17a;
      }
    }
    else {
      pcVar4 = "0";
      pcVar3 = "uv_cancel((uv_req_t*) &req)";
      uVar2 = 0x179;
    }
  }
  else {
    pcVar4 = "0";
    pcVar3 = "uv_queue_work(loop, &req, (uv_work_cb) abort, nop_done_cb)";
    uVar2 = 0x178;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-threadpool-cancel.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(threadpool_cancel_single) {
  uv_loop_t* loop;
  uv_work_t req;

  saturate_threadpool();
  loop = uv_default_loop();
  ASSERT_OK(uv_queue_work(loop, &req, (uv_work_cb) abort, nop_done_cb));
  ASSERT_OK(uv_cancel((uv_req_t*) &req));
  ASSERT_OK(done_cb_called);
  unblock_threadpool();
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(1, done_cb_called);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}